

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void llb_buildsystem_command_interface_task_discovered_dependency
               (llb_task_interface_t ti,llb_build_key_t *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  KeyType local_48;
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  paVar1 = &local_48.key.field_2;
  local_48.key._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(key + 0x10),*(long *)(key + 0x18) + *(long *)(key + 0x10)
            );
  llbuild::core::TaskInterface::discoveredDependency(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.key._M_dataplus._M_p,local_48.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void llb_buildsystem_command_interface_task_discovered_dependency(llb_task_interface_t ti, llb_build_key_t* key) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  coreti->discoveredDependency(((CAPIBuildKey *)key)->getInternalBuildKey().toData());
}